

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::VertexAttribBindingBase::CheckFB
          (VertexAttribBindingBase *this,Vec3 *expected)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int height;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  RenderTarget *pRVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fb;
  
  iVar4 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar11 = CONCAT44(extraout_var,iVar4);
  bVar1 = *(byte *)(lVar11 + 8);
  bVar2 = *(byte *)(lVar11 + 0xc);
  bVar3 = *(byte *)(lVar11 + 0x10);
  pRVar6 = deqp::Context::getRenderTarget((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar4 = pRVar6->m_width;
  pRVar6 = deqp::Context::getRenderTarget((this->super_SubcaseBase).super_GLWrapper.m_context);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&fb,(long)(iVar4 * pRVar6->m_height * 4),&local_49);
  pRVar6 = deqp::Context::getRenderTarget((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar4 = pRVar6->m_width;
  pRVar6 = deqp::Context::getRenderTarget((this->super_SubcaseBase).super_GLWrapper.m_context);
  height = pRVar6->m_height;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,iVar4,height,0x1908
             ,0x1401,fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (height < 1) {
    bVar8 = true;
  }
  else {
    bVar8 = false;
    iVar7 = 0;
    iVar5 = 0;
    do {
      iVar10 = iVar5;
      if (0 < iVar4) {
        iVar10 = iVar4 * 4 + iVar5;
        iVar9 = 0;
        do {
          if (1.0 / (float)(1 << (bVar1 & 0x1f)) <
              ABS((float)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar5] / 255.0 -
                  expected->m_data[0])) {
            fVar12 = expected->m_data[2];
            lVar11 = (long)(iVar5 + 1);
LAB_00c0018d:
            anon_unknown_0::Output
                      ("Incorrect framebuffer color at pixel (%d %d). Color is (%f %f %f). Color should be (%f %f %f).\n"
                       ,(double)((float)fb.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start[iVar5] / 255.0),
                       (double)((float)fb.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar11] / 255.0),
                       (double)((float)fb.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start[iVar5 + 2] / 255.0)
                       ,(double)expected->m_data[0],(double)expected->m_data[1],(double)fVar12);
            goto LAB_00c001ec;
          }
          lVar11 = (long)(iVar5 + 1);
          fVar12 = expected->m_data[2];
          if ((1.0 / (float)(1 << (bVar2 & 0x1f)) <
               ABS((float)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar11] / 255.0 -
                   expected->m_data[1])) ||
             (1.0 / (float)(1 << (bVar3 & 0x1f)) <
              ABS((float)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar5 + 2] / 255.0 - fVar12)))
          goto LAB_00c0018d;
          iVar9 = iVar9 + 1;
          iVar5 = iVar5 + 4;
        } while (iVar4 != iVar9);
      }
      iVar5 = iVar10;
      iVar7 = iVar7 + 1;
      bVar8 = height <= iVar7;
    } while (iVar7 != height);
  }
LAB_00c001ec:
  if (fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool CheckFB(Vec3 expected)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		Vec3					 g_color_eps  = Vec3(1.f / static_cast<float>(1 << pixelFormat.redBits),
								1.f / static_cast<float>(1 << pixelFormat.greenBits),
								1.f / static_cast<float>(1 << pixelFormat.blueBits));
		Vec3				 g_color_max = Vec3(255);
		std::vector<GLubyte> fb(getWindowWidth() * getWindowHeight() * 4);
		int					 fb_w = getWindowWidth();
		int					 fb_h = getWindowHeight();
		glReadPixels(0, 0, fb_w, fb_h, GL_RGBA, GL_UNSIGNED_BYTE, &fb[0]);
		for (GLint i = 0, y = 0; y < fb_h; ++y)
			for (GLint x = 0; x < fb_w; ++x, i += 4)
			{
				if (fabs(fb[i + 0] / g_color_max[0] - expected[0]) > g_color_eps[0] ||
					fabs(fb[i + 1] / g_color_max[1] - expected[1]) > g_color_eps[1] ||
					fabs(fb[i + 2] / g_color_max[2] - expected[2]) > g_color_eps[2])
				{

					Output("Incorrect framebuffer color at pixel (%d %d). Color is (%f %f %f). "
						   "Color should be (%f %f %f).\n",
						   x, y, fb[i + 0] / g_color_max[0], fb[i + 1] / g_color_max[1], fb[i + 2] / g_color_max[2],
						   expected[0], expected[1], expected[2]);
					return false;
				}
			}
		return true;
	}